

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O1

ErrorData * __thiscall
duckdb::Binding::ColumnNotFoundError
          (ErrorData *__return_storage_ptr__,Binding *this,string *column_name)

{
  pointer pcVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  local_68[0] = local_58;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"Values list \"%s\" does not have a column named \"%s\"","");
  psVar2 = BindingAlias::GetAlias_abi_cxx11_(&this->alias);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + psVar2->_M_string_length);
  pcVar1 = (column_name->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + column_name->_M_string_length);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_48,(StringUtil *)local_68,&local_88,&local_a8,in_R8);
  ErrorData::ErrorData(__return_storage_ptr__,BINDER,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorData Binding::ColumnNotFoundError(const string &column_name) const {
	return ErrorData(ExceptionType::BINDER, StringUtil::Format("Values list \"%s\" does not have a column named \"%s\"",
	                                                           GetAlias(), column_name));
}